

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3843.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementHexaANCF_3843::Calc_Sxi_compact
          (ChElementHexaANCF_3843 *this,VectorN *Sxi_compact,double xi,double eta,double zeta)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar21 [64];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 in_register_00001248 [56];
  undefined1 auVar24 [64];
  undefined8 in_XMM2_Qb;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  
  auVar24._8_56_ = in_register_00001248;
  auVar24._0_8_ = eta;
  auVar21._8_56_ = in_register_00001208;
  auVar21._0_8_ = xi;
  dVar2 = zeta + -1.0;
  dVar3 = xi + -1.0;
  dVar4 = eta + -1.0;
  auVar22 = auVar24._0_16_;
  auVar17 = vfmadd213sd_fma(auVar22,auVar22,auVar22);
  auVar19 = auVar21._0_16_;
  auVar17 = vfmadd231sd_fma(auVar17,auVar19,auVar19);
  auVar8._8_8_ = in_XMM2_Qb;
  auVar8._0_8_ = zeta;
  auVar9._8_8_ = in_XMM2_Qb;
  auVar9._0_8_ = zeta;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = auVar17._0_8_ + xi;
  auVar8 = vfmadd231sd_fma(auVar35,auVar8,auVar9);
  (Sxi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data.
  array[0] = (auVar8._0_8_ + zeta + -2.0) * dVar4 * dVar2 * 0.0625 * dVar3;
  dVar5 = xi + 1.0;
  (Sxi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data.
  array[1] = dVar4 * dVar2 * dVar3 * dVar3 * dVar5 * this->m_lenX * 0.03125;
  dVar6 = eta + 1.0;
  (Sxi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data.
  array[2] = this->m_lenY * 0.03125 * dVar6 * dVar4 * dVar4 * dVar2 * dVar3;
  dVar7 = zeta + 1.0;
  (Sxi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data.
  array[3] = dVar7 * this->m_lenZ * 0.03125 * dVar2 * dVar2 * dVar3 * dVar4;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = dVar2;
  auVar15 = vmulsd_avx512f(auVar25,ZEXT816(0xbfb0000000000000));
  auVar30._8_8_ = 0;
  auVar30._0_8_ = dVar5;
  auVar16 = vmulsd_avx512f(auVar30,auVar15);
  auVar27._8_8_ = 0;
  auVar27._0_8_ = dVar4;
  auVar16 = vmulsd_avx512f(auVar27,auVar16);
  auVar34._8_8_ = in_XMM2_Qb;
  auVar34._0_8_ = zeta;
  auVar10._8_8_ = in_XMM2_Qb;
  auVar10._0_8_ = zeta;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = auVar17._0_8_ - xi;
  auVar9 = vfmadd231sd_fma(auVar37,auVar34,auVar10);
  auVar33._8_8_ = 0;
  auVar33._0_8_ = auVar9._0_8_ + zeta + -2.0;
  auVar17 = vmulsd_avx512f(auVar16,auVar33);
  (Sxi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data.
  array[4] = auVar17._0_8_;
  (Sxi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data.
  array[5] = dVar5 * dVar5 * this->m_lenX * 0.03125 * dVar3 * dVar2 * dVar4;
  auVar34 = ZEXT816(0xbfa0000000000000);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = this->m_lenY;
  auVar17 = vmulsd_avx512f(auVar34,auVar17);
  auVar28._8_8_ = 0;
  auVar28._0_8_ = dVar6;
  auVar17 = vmulsd_avx512f(auVar28,auVar17);
  auVar17 = vmulsd_avx512f(auVar27,auVar17);
  auVar17 = vmulsd_avx512f(auVar27,auVar17);
  auVar17 = vmulsd_avx512f(auVar25,auVar17);
  auVar17 = vmulsd_avx512f(auVar30,auVar17);
  pdVar1 = (Sxi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.
           m_data.array + 6;
  vmovsd_avx512f(auVar17);
  *pdVar1 = *pdVar1;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = this->m_lenZ;
  auVar17 = vmulsd_avx512f(auVar34,auVar16);
  auVar32._8_8_ = 0;
  auVar32._0_8_ = dVar7;
  auVar17 = vmulsd_avx512f(auVar32,auVar17);
  auVar17 = vmulsd_avx512f(auVar25,auVar17);
  auVar17 = vmulsd_avx512f(auVar25,auVar17);
  auVar17 = vmulsd_avx512f(auVar30,auVar17);
  auVar17 = vmulsd_avx512f(auVar27,auVar17);
  pdVar1 = (Sxi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.
           m_data.array + 7;
  vmovsd_avx512f(auVar17);
  *pdVar1 = *pdVar1;
  auVar38._8_8_ = 0;
  auVar38._0_8_ = dVar5 * dVar2 * 0.0625;
  auVar18 = vmulsd_avx512f(auVar28,auVar38);
  auVar17 = vfmsub213sd_fma(auVar22,auVar22,auVar22);
  auVar17 = vfmadd231sd_fma(auVar17,auVar19,auVar19);
  auVar11._8_8_ = in_XMM2_Qb;
  auVar11._0_8_ = zeta;
  auVar12._8_8_ = in_XMM2_Qb;
  auVar12._0_8_ = zeta;
  auVar39._8_8_ = 0;
  auVar39._0_8_ = auVar17._0_8_ - xi;
  auVar16 = vfmadd231sd_fma(auVar39,auVar11,auVar12);
  auVar13._8_8_ = in_XMM2_Qb;
  auVar13._0_8_ = zeta;
  auVar19 = vaddsd_avx512f(auVar16,auVar13);
  auVar19 = vaddsd_avx512f(auVar19,ZEXT816(0xc000000000000000));
  auVar18 = vmulsd_avx512f(auVar18,auVar19);
  pdVar1 = (Sxi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.
           m_data.array + 8;
  vmovsd_avx512f(auVar18);
  *pdVar1 = *pdVar1;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = this->m_lenX;
  auVar18 = vmulsd_avx512f(auVar34,auVar18);
  auVar26._8_8_ = 0;
  auVar26._0_8_ = dVar3;
  auVar18 = vmulsd_avx512f(auVar26,auVar18);
  auVar18 = vmulsd_avx512f(auVar30,auVar18);
  auVar31._8_8_ = 0;
  auVar31._0_8_ = dVar5;
  auVar18 = vmulsd_avx512f(auVar31,auVar18);
  auVar18 = vmulsd_avx512f(auVar25,auVar18);
  auVar18 = vmulsd_avx512f(auVar28,auVar18);
  pdVar1 = (Sxi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.
           m_data.array + 9;
  vmovsd_avx512f(auVar18);
  *pdVar1 = *pdVar1;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = this->m_lenY;
  auVar18 = vmulsd_avx512f(auVar34,auVar19);
  auVar18 = vmulsd_avx512f(auVar27,auVar18);
  auVar18 = vmulsd_avx512f(auVar28,auVar18);
  auVar29._8_8_ = 0;
  auVar29._0_8_ = dVar6;
  auVar18 = vmulsd_avx512f(auVar29,auVar18);
  auVar18 = vmulsd_avx512f(auVar25,auVar18);
  auVar18 = vmulsd_avx512f(auVar31,auVar18);
  pdVar1 = (Sxi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.
           m_data.array + 10;
  vmovsd_avx512f(auVar18);
  *pdVar1 = *pdVar1;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = this->m_lenZ;
  auVar18 = vmulsd_avx512f(ZEXT816(0x3fa0000000000000),auVar22);
  auVar18 = vmulsd_avx512f(auVar32,auVar18);
  auVar18 = vmulsd_avx512f(auVar25,auVar18);
  auVar18 = vmulsd_avx512f(auVar25,auVar18);
  auVar18 = vmulsd_avx512f(auVar31,auVar18);
  auVar18 = vmulsd_avx512f(auVar29,auVar18);
  pdVar1 = (Sxi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.
           m_data.array + 0xb;
  vmovsd_avx512f(auVar18);
  *pdVar1 = *pdVar1;
  auVar18 = vmulsd_avx512f(auVar26,auVar15);
  auVar18 = vmulsd_avx512f(auVar29,auVar18);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = auVar17._0_8_ + xi;
  auVar15._8_8_ = in_XMM2_Qb;
  auVar15._0_8_ = zeta;
  auVar14._8_8_ = in_XMM2_Qb;
  auVar14._0_8_ = zeta;
  auVar17 = vfmadd231sd_fma(auVar20,auVar15,auVar14);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = auVar17._0_8_ + zeta + -2.0;
  auVar18 = vmulsd_avx512f(auVar18,auVar23);
  (Sxi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data.
  array[0xc] = auVar18._0_8_;
  (Sxi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data.
  array[0xd] = dVar6 * dVar2 * dVar3 * dVar3 * dVar5 * this->m_lenX * -0.03125;
  (Sxi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data.
  array[0xe] = dVar3 * dVar2 * dVar6 * dVar6 * dVar4 * this->m_lenY * 0.03125;
  (Sxi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data.
  array[0xf] = dVar6 * dVar3 * dVar2 * dVar2 * dVar7 * this->m_lenZ * -0.03125;
  auVar18 = vmulsd_avx512f(auVar32,ZEXT816(0xbfb0000000000000));
  auVar19 = vmulsd_avx512f(auVar26,auVar18);
  auVar19 = vmulsd_avx512f(auVar27,auVar19);
  auVar36._8_8_ = 0;
  auVar36._0_8_ = (auVar8._0_8_ - zeta) + -2.0;
  auVar19 = vmulsd_avx512f(auVar19,auVar36);
  (Sxi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data.
  array[0x10] = auVar19._0_8_;
  (Sxi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data.
  array[0x11] = dVar7 * dVar5 * this->m_lenX * -0.03125 * dVar3 * dVar3 * dVar4;
  (Sxi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data.
  array[0x12] = dVar7 * this->m_lenY * -0.03125 * dVar6 * dVar4 * dVar4 * dVar3;
  (Sxi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data.
  array[0x13] = dVar7 * dVar7 * this->m_lenZ * 0.03125 * dVar2 * dVar3 * dVar4;
  (Sxi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data.
  array[0x14] = dVar5 * dVar7 * 0.0625 * dVar4 * ((auVar9._0_8_ - zeta) + -2.0);
  (Sxi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data.
  array[0x15] = dVar7 * dVar5 * dVar5 * this->m_lenX * -0.03125 * dVar3 * dVar4;
  (Sxi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data.
  array[0x16] = dVar5 * dVar7 * this->m_lenY * 0.03125 * dVar6 * dVar4 * dVar4;
  (Sxi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data.
  array[0x17] = dVar5 * dVar7 * dVar7 * this->m_lenZ * -0.03125 * dVar2 * dVar4;
  (Sxi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data.
  array[0x18] = ((auVar16._0_8_ - zeta) + -2.0) * dVar6 * dVar5 * auVar18._0_8_;
  (Sxi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data.
  array[0x19] = dVar6 * dVar7 * dVar5 * dVar5 * dVar3 * this->m_lenX * 0.03125;
  (Sxi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data.
  array[0x1a] = dVar5 * dVar7 * dVar6 * dVar6 * dVar4 * this->m_lenY * 0.03125;
  (Sxi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data.
  array[0x1b] = dVar6 * dVar5 * dVar7 * dVar7 * dVar2 * this->m_lenZ * 0.03125;
  (Sxi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data.
  array[0x1c] = dVar6 * dVar7 * 0.0625 * dVar3 * ((auVar17._0_8_ - zeta) + -2.0);
  (Sxi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data.
  array[0x1d] = dVar6 * dVar7 * dVar3 * dVar3 * dVar5 * this->m_lenX * 0.03125;
  (Sxi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data.
  array[0x1e] = dVar3 * dVar7 * dVar6 * dVar6 * dVar4 * this->m_lenY * -0.03125;
  (Sxi_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data.
  array[0x1f] = dVar6 * dVar3 * dVar7 * dVar7 * dVar2 * this->m_lenZ * -0.03125;
  return;
}

Assistant:

void ChElementHexaANCF_3843::Calc_Sxi_compact(VectorN& Sxi_compact, double xi, double eta, double zeta) {
    Sxi_compact(0) =
        0.0625 * (zeta - 1) * (xi - 1) * (eta - 1) * (eta * eta + eta + xi * xi + xi + zeta * zeta + zeta - 2);
    Sxi_compact(1) = 0.03125 * m_lenX * (xi + 1) * (xi - 1) * (xi - 1) * (zeta - 1) * (eta - 1);
    Sxi_compact(2) = 0.03125 * m_lenY * (eta + 1) * (eta - 1) * (eta - 1) * (zeta - 1) * (xi - 1);
    Sxi_compact(3) = 0.03125 * m_lenZ * (zeta + 1) * (zeta - 1) * (zeta - 1) * (xi - 1) * (eta - 1);
    Sxi_compact(4) =
        -0.0625 * (zeta - 1) * (xi + 1) * (eta - 1) * (eta * eta + eta + xi * xi - xi + zeta * zeta + zeta - 2);
    Sxi_compact(5) = 0.03125 * m_lenX * (xi - 1) * (xi + 1) * (xi + 1) * (zeta - 1) * (eta - 1);
    Sxi_compact(6) = -0.03125 * m_lenY * (eta + 1) * (eta - 1) * (eta - 1) * (zeta - 1) * (xi + 1);
    Sxi_compact(7) = -0.03125 * m_lenZ * (zeta + 1) * (zeta - 1) * (zeta - 1) * (xi + 1) * (eta - 1);
    Sxi_compact(8) =
        0.0625 * (zeta - 1) * (xi + 1) * (eta + 1) * (eta * eta - eta + xi * xi - xi + zeta * zeta + zeta - 2);
    Sxi_compact(9) = -0.03125 * m_lenX * (xi - 1) * (xi + 1) * (xi + 1) * (zeta - 1) * (eta + 1);
    Sxi_compact(10) = -0.03125 * m_lenY * (eta - 1) * (eta + 1) * (eta + 1) * (zeta - 1) * (xi + 1);
    Sxi_compact(11) = 0.03125 * m_lenZ * (zeta + 1) * (zeta - 1) * (zeta - 1) * (xi + 1) * (eta + 1);
    Sxi_compact(12) =
        -0.0625 * (zeta - 1) * (xi - 1) * (eta + 1) * (eta * eta - eta + xi * xi + xi + zeta * zeta + zeta - 2);
    Sxi_compact(13) = -0.03125 * m_lenX * (xi + 1) * (xi - 1) * (xi - 1) * (zeta - 1) * (eta + 1);
    Sxi_compact(14) = 0.03125 * m_lenY * (eta - 1) * (eta + 1) * (eta + 1) * (zeta - 1) * (xi - 1);
    Sxi_compact(15) = -0.03125 * m_lenZ * (zeta + 1) * (zeta - 1) * (zeta - 1) * (xi - 1) * (eta + 1);
    Sxi_compact(16) =
        -0.0625 * (zeta + 1) * (xi - 1) * (eta - 1) * (eta * eta + eta + xi * xi + xi + zeta * zeta - zeta - 2);
    Sxi_compact(17) = -0.03125 * m_lenX * (xi + 1) * (xi - 1) * (xi - 1) * (zeta + 1) * (eta - 1);
    Sxi_compact(18) = -0.03125 * m_lenY * (eta + 1) * (eta - 1) * (eta - 1) * (zeta + 1) * (xi - 1);
    Sxi_compact(19) = 0.03125 * m_lenZ * (zeta - 1) * (zeta + 1) * (zeta + 1) * (xi - 1) * (eta - 1);
    Sxi_compact(20) =
        0.0625 * (zeta + 1) * (xi + 1) * (eta - 1) * (eta * eta + eta + xi * xi - xi + zeta * zeta - zeta - 2);
    Sxi_compact(21) = -0.03125 * m_lenX * (xi - 1) * (xi + 1) * (xi + 1) * (zeta + 1) * (eta - 1);
    Sxi_compact(22) = 0.03125 * m_lenY * (eta + 1) * (eta - 1) * (eta - 1) * (zeta + 1) * (xi + 1);
    Sxi_compact(23) = -0.03125 * m_lenZ * (zeta - 1) * (zeta + 1) * (zeta + 1) * (xi + 1) * (eta - 1);
    Sxi_compact(24) =
        -0.0625 * (zeta + 1) * (xi + 1) * (eta + 1) * (eta * eta - eta + xi * xi - xi + zeta * zeta - zeta - 2);
    Sxi_compact(25) = 0.03125 * m_lenX * (xi - 1) * (xi + 1) * (xi + 1) * (zeta + 1) * (eta + 1);
    Sxi_compact(26) = 0.03125 * m_lenY * (eta - 1) * (eta + 1) * (eta + 1) * (zeta + 1) * (xi + 1);
    Sxi_compact(27) = 0.03125 * m_lenZ * (zeta - 1) * (zeta + 1) * (zeta + 1) * (xi + 1) * (eta + 1);
    Sxi_compact(28) =
        0.0625 * (zeta + 1) * (xi - 1) * (eta + 1) * (eta * eta - eta + xi * xi + xi + zeta * zeta - zeta - 2);
    Sxi_compact(29) = 0.03125 * m_lenX * (xi + 1) * (xi - 1) * (xi - 1) * (zeta + 1) * (eta + 1);
    Sxi_compact(30) = -0.03125 * m_lenY * (eta - 1) * (eta + 1) * (eta + 1) * (zeta + 1) * (xi - 1);
    Sxi_compact(31) = -0.03125 * m_lenZ * (zeta - 1) * (zeta + 1) * (zeta + 1) * (xi - 1) * (eta + 1);
}